

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcGetBytecodeNoCache(char **bytecode)

{
  int iVar1;
  undefined1 local_38 [8];
  TraceScope traceScope;
  char **bytecode_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    bytecode_local._4_4_ = 0;
  }
  else {
    if (nullcGetBytecodeNoCache::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcGetBytecodeNoCache::token);
      if (iVar1 != 0) {
        nullcGetBytecodeNoCache::token = NULLC::TraceGetToken("nullc","nullcGetBytecodeNoCache");
        __cxa_guard_release(&nullcGetBytecodeNoCache::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_38,nullcGetBytecodeNoCache::token);
    if (NULLC::compilerCtx == (CompilerContext *)0x0) {
      NULLC::nullcLastError = "ERROR: there is no active compiler context";
      bytecode_local._4_4_ = 0;
    }
    else {
      bytecode_local._4_4_ = GetBytecode(NULLC::compilerCtx,bytecode);
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_38);
  }
  return bytecode_local._4_4_;
}

Assistant:

unsigned nullcGetBytecodeNoCache(char **bytecode)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcGetBytecodeNoCache");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	return GetBytecode(*compilerCtx, bytecode);
}